

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

void get_var_sse_sum_16x16_dual_avx2
               (uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int h,uint32_t *sse16x16,
               uint *tot_sse,int *tot_sum,uint32_t *var16x16)

{
  undefined1 auVar1 [32];
  __m256i set_one_minusone_00;
  undefined1 auVar2 [32];
  int in_R8D;
  undefined8 *in_R9;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m128i sum_temp16x16;
  __m256i sum_sse_order_add_1;
  __m256i sum_sse_order_add;
  int i;
  __m256i set_one_minusone;
  __m256i sum_16x16 [2];
  __m256i sse_16x16 [2];
  undefined8 local_370;
  undefined8 local_340;
  undefined4 local_2e4;
  __m256i *sum_8x16;
  __m256i *sse_8x16;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  longlong lVar10;
  uint8_t *ref_00;
  uint8_t *src_00;
  int *tot_sum_00;
  uint *in_stack_fffffffffffffdc0;
  __m256i *in_stack_fffffffffffffdc8;
  __m256i *in_stack_fffffffffffffdd0;
  
  sum_8x16 = (__m256i *)0x0;
  sse_8x16 = (__m256i *)0x0;
  uVar7 = 0;
  ref_00 = (uint8_t *)0x0;
  src_00 = (uint8_t *)0x0;
  uVar8 = 0;
  uVar9 = 0;
  lVar10 = 0;
  tot_sum_00 = (int *)0x0;
  auVar4 = vpinsrw_avx(ZEXT216(0xff01),0xff01,1);
  auVar4 = vpinsrw_avx(auVar4,0xff01,2);
  auVar4 = vpinsrw_avx(auVar4,0xff01,3);
  auVar4 = vpinsrw_avx(auVar4,0xff01,4);
  auVar4 = vpinsrw_avx(auVar4,0xff01,5);
  auVar4 = vpinsrw_avx(auVar4,0xff01,6);
  auVar4 = vpinsrw_avx(auVar4,0xff01,7);
  auVar6 = vpinsrw_avx(ZEXT216(0xff01),0xff01,1);
  auVar6 = vpinsrw_avx(auVar6,0xff01,2);
  auVar6 = vpinsrw_avx(auVar6,0xff01,3);
  auVar6 = vpinsrw_avx(auVar6,0xff01,4);
  auVar6 = vpinsrw_avx(auVar6,0xff01,5);
  auVar6 = vpinsrw_avx(auVar6,0xff01,6);
  auVar6 = vpinsrw_avx(auVar6,0xff01,7);
  auVar3 = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar6;
  auVar5 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
  auVar4 = auVar3;
  auVar6 = auVar5;
  for (local_2e4 = 0; local_2e4 < in_R8D; local_2e4 = local_2e4 + 1) {
    set_one_minusone_00[1] = uVar8;
    set_one_minusone_00[0] = uVar7;
    set_one_minusone_00[2] = uVar9;
    set_one_minusone_00[3] = lVar10;
    auVar4 = auVar3;
    auVar6 = auVar5;
    calc_sum_sse_wd32_avx2(src_00,ref_00,set_one_minusone_00,sse_8x16,sum_8x16);
  }
  calc_sum_sse_order(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                     tot_sum_00);
  auVar2._16_8_ = auVar6._0_8_;
  auVar2._0_16_ = auVar4;
  auVar2._24_8_ = auVar6._8_8_;
  auVar1._16_8_ = auVar6._0_8_;
  auVar1._0_16_ = auVar4;
  auVar1._24_8_ = auVar6._8_8_;
  auVar1 = vphaddd_avx2(auVar2,auVar1);
  local_340 = auVar1._0_8_;
  *in_R9 = local_340;
  auVar4 = vpmulld_avx(auVar1._16_16_,auVar1._16_16_);
  auVar4 = vpsrld_avx(auVar4,ZEXT416(8));
  auVar4 = vpsubd_avx(auVar1._0_16_,auVar4);
  local_370 = auVar4._0_8_;
  *(undefined8 *)tot_sum = local_370;
  return;
}

Assistant:

static inline void get_var_sse_sum_16x16_dual_avx2(
    const uint8_t *src, int src_stride, const uint8_t *ref,
    const int ref_stride, const int h, uint32_t *sse16x16,
    unsigned int *tot_sse, int *tot_sum, uint32_t *var16x16) {
  assert(h <= 128);  // May overflow for larger height.
  __m256i sse_16x16[2], sum_16x16[2];
  sum_16x16[0] = _mm256_setzero_si256();
  sse_16x16[0] = _mm256_setzero_si256();
  sum_16x16[1] = sum_16x16[0];
  sse_16x16[1] = sse_16x16[0];
  const __m256i set_one_minusone = _mm256_set1_epi16((short)0xff01);

  for (int i = 0; i < h; i++) {
    // Process 16x32 block of one row.
    calc_sum_sse_wd32_avx2(src, ref, set_one_minusone, sse_16x16, sum_16x16);
    src += src_stride;
    ref += ref_stride;
  }

  const __m256i sum_sse_order_add =
      calc_sum_sse_order(sse_16x16, sum_16x16, tot_sse, tot_sum);

  const __m256i sum_sse_order_add_1 =
      _mm256_hadd_epi32(sum_sse_order_add, sum_sse_order_add);

  // s0+s1 s2+s3 x x
  _mm_storel_epi64((__m128i *)sse16x16,
                   _mm256_castsi256_si128(sum_sse_order_add_1));

  // d0+d1 d2+d3 x x
  const __m128i sum_temp16x16 =
      _mm256_extractf128_si256(sum_sse_order_add_1, 1);

  // (d0xd0 >> 6)=f0 (d1xd1 >> 6)=f1 (d2xd2 >> 6)=f2 (d3xd3 >> 6)=f3
  const __m128i mull_results =
      _mm_srli_epi32(_mm_mullo_epi32(sum_temp16x16, sum_temp16x16), 8);

  // s0-f0=v0 s1-f1=v1 s2-f2=v2 s3-f3=v3
  const __m128i variance_16x16 =
      _mm_sub_epi32(_mm256_castsi256_si128(sum_sse_order_add_1), mull_results);

  // v0 v1 v2 v3
  _mm_storel_epi64((__m128i *)var16x16, variance_16x16);
}